

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
* __thiscall
bidfx_public_api::price::PricingSession::GetProviderProperties
          (vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
           *__return_storage_ptr__,PricingSession *this)

{
  initializer_list<bidfx_public_api::price::provider::ProviderProperties> __l;
  ProviderProperties *local_a8;
  allocator<bidfx_public_api::price::provider::ProviderProperties> local_85 [13];
  ProviderProperties *local_78;
  ProviderProperties local_70;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  PricingSession *this_local;
  
  local_78 = &local_70;
  local_18 = (undefined1  [8])this;
  this_local = (PricingSession *)__return_storage_ptr__;
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[8])();
  local_28 = &local_70;
  local_20 = 1;
  std::allocator<bidfx_public_api::price::provider::ProviderProperties>::allocator(local_85);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
  ::vector(__return_storage_ptr__,__l,local_85);
  std::allocator<bidfx_public_api::price::provider::ProviderProperties>::~allocator(local_85);
  local_a8 = (ProviderProperties *)&local_28;
  do {
    local_a8 = local_a8 + -1;
    provider::ProviderProperties::~ProviderProperties(local_a8);
  } while (local_a8 != &local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ProviderProperties> PricingSession::GetProviderProperties()
{
    return {pixie_provider_->GetProperties()};
}